

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerKeepAlive.cpp
# Opt level: O0

void __thiscall
ki::protocol::control::ServerKeepAlive::write_to(ServerKeepAlive *this,ostream *ostream)

{
  Field<int> *this_00;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  ostream *ostream_local;
  ServerKeepAlive *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ostream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"m_session_id",&local_89);
  ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_88,true);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"m_timestamp",&local_c1);
  this_00 = ki::dml::Record::add_field<int>((Record *)local_68,(string *)local_c0,true);
  ki::dml::Field<int>::set_value(this_00,this->m_timestamp);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  ki::dml::Record::write_to
            ((Record *)local_68,
             (ostream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void ServerKeepAlive::write_to(std::ostream& ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id");
		record.add_field<dml::INT>("m_timestamp")->set_value(m_timestamp);
		record.write_to(ostream);
	}